

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O3

bool __thiscall
__gnu_cxx::__ops::_Iter_less_val::operator()
          (_Iter_less_val *this,pair<crnlib::vec<6U,_float>,_unsigned_int> *__it,
          pair<crnlib::vec<6U,_float>,_unsigned_int> *__val)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  
  fVar2 = (__it->first).m_s[0];
  fVar3 = (__val->first).m_s[0];
  if (fVar3 <= fVar2) {
    lVar1 = 1;
    fVar4 = fVar3;
    fVar5 = fVar2;
    do {
      if (((fVar5 != fVar4) || (NAN(fVar5) || NAN(fVar4))) || (lVar1 == 6)) {
        if (fVar2 <= fVar3) {
          lVar1 = 1;
          do {
            if (((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) || (lVar1 == 6)) {
              return __it->second < __val->second;
            }
            fVar3 = (__val->first).m_s[lVar1];
            fVar2 = (__it->first).m_s[lVar1];
            lVar1 = lVar1 + 1;
          } while (fVar2 <= fVar3);
        }
        return false;
      }
      fVar5 = (__it->first).m_s[lVar1];
      fVar4 = (__val->first).m_s[lVar1];
      lVar1 = lVar1 + 1;
    } while (fVar4 <= fVar5);
  }
  return true;
}

Assistant:

inline bool operator<(const vec& rhs) const
        {
            for (uint i = 0; i < N; i++)
            {
                if (m_s[i] < rhs.m_s[i])
                {
                    return true;
                }
                else if (m_s[i] != rhs.m_s[i])
                {
                    return false;
                }
            }

            return false;
        }